

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O3

TPZVec<TPZGeoElSidePartition> * __thiscall
TPZVec<TPZGeoElSidePartition>::operator=
          (TPZVec<TPZGeoElSidePartition> *this,TPZVec<TPZGeoElSidePartition> *copy)

{
  TPZGeoElSidePartition *pTVar1;
  TPZGeoElSidePartition *pTVar2;
  long lVar3;
  long lVar4;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this,copy->fNElements);
    if (0 < copy->fNElements) {
      lVar4 = 0x18;
      lVar3 = 0;
      do {
        pTVar1 = copy->fStore;
        pTVar2 = this->fStore;
        *(undefined4 *)((long)pTVar2 + lVar4 + -8) = *(undefined4 *)((long)pTVar1 + lVar4 + -8);
        *(undefined8 *)((long)pTVar2 + lVar4 + -0x10) =
             *(undefined8 *)((long)pTVar1 + lVar4 + -0x10);
        operator=((TPZVec<TPZGeoElSidePartition> *)
                  ((long)&(pTVar2->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar4),
                  (TPZVec<TPZGeoElSidePartition> *)
                  ((long)&(pTVar1->fCurrent).super_TPZSavable._vptr_TPZSavable + lVar4));
        lVar3 = lVar3 + 1;
        lVar4 = lVar4 + 0x38;
      } while (lVar3 < copy->fNElements);
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}